

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

void initTable(vm *v)

{
  uint uVar1;
  module *pmVar2;
  table_pointer ptVar3;
  element_pointer paVar4;
  function_index *pfVar5;
  uint64 uVar6;
  int j;
  ulong uVar7;
  module *module;
  int i;
  ulong uVar8;
  
  pmVar2 = v->m;
  if ((pmVar2->table_sec).table_segment_count != 0) {
    ptVar3 = (pmVar2->table_sec).table_segment_addr;
    (v->table).table_type = ptVar3;
    uVar1 = (&(ptVar3->limit).min)[(ptVar3->limit).tag != '\0'];
    (v->table).itemCount = uVar1;
    pfVar5 = (function_index *)malloc((ulong)uVar1 << 2);
    (v->table).item = pfVar5;
    for (uVar8 = 0; uVar8 < (pmVar2->element_sec).element_segment_count; uVar8 = uVar8 + 1) {
      paVar4 = (pmVar2->element_sec).element_segment_addr;
      execInst(v,&paVar4[uVar8].offset);
      uVar6 = popU64(&v->operandStack);
      for (uVar7 = 0; uVar7 < paVar4[uVar8].init_data_count; uVar7 = uVar7 + 1) {
        (v->table).item[(uint)((int)uVar6 + (int)uVar7)] = paVar4[uVar8].init_data[uVar7];
      }
    }
  }
  return;
}

Assistant:

void initTable(vm *v) {
    if (v->m->table_sec.table_segment_count > 0) {
        table *table = &v->table;
        module *module = v->m;
        table->table_type = module->table_sec.table_segment_addr;
        if (table->table_type->limit.tag == only_min) {
            table->itemCount = table->table_type->limit.min;
        } else {
            table->itemCount = table->table_type->limit.max;
        }
        table->item = malloc(table->itemCount * sizeof(func_index));
        /*写入元素段的内容*/
        for (int i = 0; i < module->element_sec.element_segment_count; ++i) {
            element_pointer ep = module->element_sec.element_segment_addr + i;
            execInst(v, &ep->offset);
            uint64 offset = popU64(&v->operandStack);
            for (int j = 0; j < ep->init_data_count; ++j) {
                setTable(table, offset + j, *(ep->init_data + j));
            }
        }
    }
}